

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.cpp
# Opt level: O1

int __thiscall FName::NameManager::AddName(NameManager *this,char *text,uint hash,uint bucket)

{
  int iVar1;
  size_t sVar2;
  NameBlock *pNVar3;
  NameEntry *pNVar4;
  int iVar5;
  size_t size;
  char *__dest;
  
  pNVar3 = this->Blocks;
  sVar2 = strlen(text);
  if ((pNVar3 == (NameBlock *)0x0) || (0xfff < pNVar3->NextAlloc + sVar2 + 1)) {
    size = 0x1000;
    if (0x1000 < sVar2 + 0x11) {
      size = sVar2 + 0x11;
    }
    pNVar3 = (NameBlock *)
             M_Malloc_Dbg(size,
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/name.cpp"
                          ,0xfc);
    pNVar3->NextAlloc = 0x10;
    pNVar3->NextBlock = this->Blocks;
    this->Blocks = pNVar3;
  }
  __dest = (char *)((long)&pNVar3->NextAlloc + pNVar3->NextAlloc);
  strcpy(__dest,text);
  pNVar3->NextAlloc = pNVar3->NextAlloc + sVar2 + 1;
  iVar1 = this->MaxNames;
  if (iVar1 <= this->NumNames) {
    iVar5 = iVar1 + 0x34b;
    if (iVar1 != 0) {
      iVar5 = iVar1 + 0x100;
    }
    this->MaxNames = iVar5;
    pNVar4 = (NameEntry *)
             M_Realloc_Dbg(this->NameArray,(long)iVar5 << 4,
                           "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/name.cpp"
                           ,0xdf);
    this->NameArray = pNVar4;
  }
  pNVar4 = this->NameArray;
  iVar1 = this->NumNames;
  pNVar4[iVar1].Text = __dest;
  pNVar4[iVar1].Hash = hash;
  pNVar4[iVar1].NextHash = this->Buckets[bucket];
  this->Buckets[bucket] = iVar1;
  this->NumNames = iVar1 + 1;
  return iVar1;
}

Assistant:

int FName::NameManager::AddName (const char *text, unsigned int hash, unsigned int bucket)
{
	char *textstore;
	NameBlock *block = Blocks;
	size_t len = strlen (text) + 1;

	// Get a block large enough for the name. Only the first block in the
	// list is ever considered for name storage.
	if (block == NULL || block->NextAlloc + len >= BLOCK_SIZE)
	{
		block = AddBlock (len);
	}

	// Copy the string into the block.
	textstore = (char *)block + block->NextAlloc;
	strcpy (textstore, text);
	block->NextAlloc += len;

	// Add an entry for the name to the NameArray
	if (NumNames >= MaxNames)
	{
		// If no names have been defined yet, make the first allocation
		// large enough to hold all the predefined names.
		MaxNames += MaxNames == 0 ? countof(PredefinedNames) + NAME_GROW_AMOUNT : NAME_GROW_AMOUNT;

		NameArray = (NameEntry *)M_Realloc (NameArray, MaxNames * sizeof(NameEntry));
	}

	NameArray[NumNames].Text = textstore;
	NameArray[NumNames].Hash = hash;
	NameArray[NumNames].NextHash = Buckets[bucket];
	Buckets[bucket] = NumNames;

	return NumNames++;
}